

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<long_double>::Print(TPZFrontSym<long_double> *this,char *name,ostream *out)

{
  ulong uVar1;
  char cVar2;
  size_t sVar3;
  ostream *poVar4;
  long *plVar5;
  longdouble *plVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  cVar2 = (char)out;
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Frontal Matrix Size          ",0x1d);
  poVar4 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Maximum Frontal Matrix Size  ",0x1d);
  plVar5 = (long *)std::ostream::operator<<(out,(this->super_TPZFront<long_double>).fMaxFront);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Local Indexation ",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Position  ",10);
  std::__ostream_insert<char,std::char_traits<char>>(out," Local index",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (0 < (this->super_TPZFront<long_double>).fLocal.fNElements) {
    lVar9 = 0;
    do {
      poVar4 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"         ",9);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZFront<long_double>).fLocal.fNElements);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Global Indexation ",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Position  ",10);
  std::__ostream_insert<char,std::char_traits<char>>(out," Global index",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (0 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements) {
    lVar9 = 0;
    do {
      poVar4 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"            ",0xc);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZFront<long_double>).fGlobal.super_TPZVec<long>.fNElements);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Local Freed Equatoins  ",0x17);
  poVar4 = std::ostream::_M_insert<long>((long)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"position ",9);
  std::__ostream_insert<char,std::char_traits<char>>(out,"Local Equation ",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar9 = (this->super_TPZFront<long_double>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.
          fNElements;
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      poVar4 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"             ",0xd);
      plVar5 = (long *)std::ostream::operator<<
                                 (poVar4,(this->super_TPZFront<long_double>).fFree.
                                         super_TPZManVector<int,_10>.super_TPZVec<int>.fStore
                                         [lVar10]);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Frontal Matrix ",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  lVar9 = (this->super_TPZFront<long_double>).fFront;
  if (0 < lVar9 && 0 < (this->super_TPZFront<long_double>).fData.fNElements) {
    uVar8 = 0;
    do {
      uVar1 = uVar8 + 1;
      if (0 < lVar9) {
        uVar7 = 0;
        do {
          if (uVar8 < uVar7) {
            plVar6 = (longdouble *)
                     ((long)(this->super_TPZFront<long_double>).fData.fStore +
                     uVar8 * 0x10 + (uVar7 * (uVar7 + 1) & 0xfffffffffffffffe) * 8);
          }
          else {
            plVar6 = (this->super_TPZFront<long_double>).fData.fStore + (uVar1 * uVar8 >> 1) + uVar7
            ;
          }
          uVar7 = uVar7 + 1;
          poVar4 = std::ostream::_M_insert<long_double>(*plVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        } while ((long)uVar7 < (this->super_TPZFront<long_double>).fFront);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      lVar9 = (this->super_TPZFront<long_double>).fFront;
      uVar8 = uVar1;
    } while ((long)uVar1 < lVar9);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::Print(const char *name, std::ostream& out) const
{
	if(name) out << name << endl;
	int64_t i,j,loop_limit;
	
	
	out <<  "Frontal Matrix Size          "<< this->fFront << endl;
	out <<  "Maximum Frontal Matrix Size  "<< this->fMaxFront << endl;
	
	out << endl;
	out <<  "Local Indexation "<< endl;
	out <<  "Position  "<<" Local index"<< endl;
	for(i=0;i<this->fLocal.NElements();i++){
		out <<   i <<  "         "  << this->fLocal[i] << endl;
	}
	
	out << endl;
	out <<  "Global Indexation "<< endl;
	out <<  "Position  "<<" Global index"<< endl;
	
	for(i=0;i<this->fGlobal.NElements();i++){
		out <<   i <<  "            "<< this->fGlobal[i] << endl;
	}
	
	out << endl;
	out <<  "Local Freed Equatoins  "<< this->fFree.NElements() << endl;
	out <<  "position "<<   "Local Equation "<<endl;
	loop_limit=this->fFree.NElements();
	for(i=0;i<loop_limit;i++){
		out <<  i <<  "             " << this->fFree[i] << endl;
	}
	out <<  "Frontal Matrix "<< endl;
	if(this->fData.NElements() > 0) {
		for(i=0;i<this->fFront;i++){
			for(j=0;j<this->fFront;j++) out << ((i<j) ? Element(i,j) : Element(j,i)) <<  " ";
			out << endl;
		}
	}
}